

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

void StorePackageRegistry(cmMakefile *mf,string *package,char *content,char *hash)

{
  bool bVar1;
  ostream *poVar2;
  string local_480;
  string local_460 [32];
  undefined1 local_440 [8];
  ostringstream e;
  undefined1 local_2c8 [8];
  cmGeneratedFileStream entry;
  undefined1 local_48 [8];
  string fname;
  char *hash_local;
  char *content_local;
  string *package_local;
  cmMakefile *mf_local;
  
  fname.field_2._8_8_ = hash;
  std::__cxx11::string::string((string *)local_48);
  bVar1 = cmsys::SystemTools::GetEnv("HOME",(string *)local_48);
  if (bVar1) {
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
    std::__cxx11::string::operator+=((string *)local_48,"/.cmake/packages/");
    std::__cxx11::string::operator+=((string *)local_48,(string *)package);
    entry._608_8_ = cmsys::SystemTools::MakeDirectory((string *)local_48,(mode_t *)0x0);
    std::__cxx11::string::operator+=((string *)local_48,"/");
    std::__cxx11::string::operator+=((string *)local_48,(char *)fname.field_2._8_8_);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_48);
    if (!bVar1) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_2c8,(string *)local_48,true,None);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)(local_2c8 + (long)*(_func_int **)((long)local_2c8 + -0x18)));
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)local_2c8,content);
        std::operator<<(poVar2,"\n");
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
        poVar2 = std::operator<<((ostream *)local_440,"Cannot create package registry file:\n");
        poVar2 = std::operator<<(poVar2,"  ");
        poVar2 = std::operator<<(poVar2,(string *)local_48);
        poVar2 = std::operator<<(poVar2,"\n");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        poVar2 = std::operator<<(poVar2,local_460);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string(local_460);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,WARNING,&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2c8);
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

static void StorePackageRegistry(cmMakefile& mf, std::string const& package,
                                 const char* content, const char* hash)
{
#  if defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) !=
      B_OK) {
    return;
  }
  std::string fname = cmStrCat(dir, "/cmake/packages/", package);
#  else
  std::string fname;
  if (!cmSystemTools::GetEnv("HOME", fname)) {
    return;
  }
  cmSystemTools::ConvertToUnixSlashes(fname);
  fname += "/.cmake/packages/";
  fname += package;
#  endif
  cmSystemTools::MakeDirectory(fname);
  fname += "/";
  fname += hash;
  if (!cmSystemTools::FileExists(fname)) {
    cmGeneratedFileStream entry(fname, true);
    if (entry) {
      entry << content << "\n";
    } else {
      std::ostringstream e;
      /* clang-format off */
      e << "Cannot create package registry file:\n"
        << "  " << fname << "\n"
        << cmSystemTools::GetLastSystemError() << "\n";
      /* clang-format on */
      mf.IssueMessage(MessageType::WARNING, e.str());
    }
  }
}